

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

int sndio_stream_stop(cubeb_stream_conflict2 *s)

{
  long in_RDI;
  void *dummy;
  void *local_10 [2];
  
  if (*(int *)(in_RDI + 0x4c) != 0) {
    *(undefined4 *)(in_RDI + 0x4c) = 0;
    pthread_join(*(pthread_t *)(in_RDI + 0x10),local_10);
  }
  return 0;
}

Assistant:

static int
sndio_stream_stop(cubeb_stream *s)
{
  void *dummy;

  DPR("sndio_stream_stop()\n");
  if (s->active) {
    s->active = 0;
    pthread_join(s->th, &dummy);
  }
  return CUBEB_OK;
}